

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

bool __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
::operator()(greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
             *this,filtration_index_t a,filtration_index_t b)

{
  int iVar1;
  ulong uVar2;
  filtration_index_t _filtration_index;
  filtration_index_t _filtration_index_00;
  filtration_entry_t a_00;
  filtration_entry_t a_01;
  index_t iVar3;
  index_t iVar4;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var5;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var7;
  pair<float,_int> in_RDX;
  pair<float,_int> in_RSI;
  value_t vVar8;
  value_t vVar9;
  tuple<unsigned_long,_unsigned_long,_int> *tb;
  tuple<unsigned_long,_unsigned_long,_int> *ta;
  filtration_entry_t *in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  float fVar10;
  undefined4 local_64;
  undefined1 local_60 [24];
  undefined1 *local_48;
  pair<float,_int> local_40;
  pair<float,_int> local_38;
  pair<float,_int> local_30;
  pair<float,_int> local_14;
  pair<float,_int> local_c;
  bool local_1;
  
  local_14 = in_RDX;
  local_c = in_RSI;
  vVar8 = get_filtration((filtration_index_t)in_RSI);
  local_30 = local_14;
  vVar9 = get_filtration((filtration_index_t)local_14);
  if (vVar8 <= vVar9) {
    local_38 = local_c;
    vVar8 = get_filtration((filtration_index_t)local_c);
    local_40 = local_14;
    vVar9 = get_filtration((filtration_index_t)local_14);
    if (vVar9 <= vVar8) {
      fVar10 = local_c.first;
      _filtration_index.super_pair<float,_int>.second = in_stack_fffffffffffffee4;
      _filtration_index.super_pair<float,_int>.first = in_stack_fffffffffffffee0;
      filtration_entry_t::filtration_entry_t(in_stack_fffffffffffffed8,_filtration_index);
      a_00.super_pair<float,_entry_t>.second.index = in_stack_ffffffffffffff88;
      a_00.super_pair<float,_entry_t>.first = (float)local_64;
      a_00.super_pair<float,_entry_t>.second._4_4_ = fVar10;
      get_coboundary_size_and_gap_and_pivot(in_stack_ffffffffffffff68,a_00);
      local_48 = local_60;
      _filtration_index_00.super_pair<float,_int>.second = in_stack_fffffffffffffee4;
      _filtration_index_00.super_pair<float,_int>.first = in_stack_fffffffffffffee0;
      filtration_entry_t::filtration_entry_t(in_stack_fffffffffffffed8,_filtration_index_00);
      a_01.super_pair<float,_entry_t>.second.index = in_stack_ffffffffffffff88;
      a_01.super_pair<float,_entry_t>.first = (float)local_64;
      a_01.super_pair<float,_entry_t>.second._4_4_ = fVar10;
      get_coboundary_size_and_gap_and_pivot(in_stack_ffffffffffffff68,a_01);
      p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                         ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efe4b);
      uVar2 = *p_Var5;
      p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                         ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efe60);
      if (uVar2 < *p_Var5) {
        local_1 = true;
      }
      else {
        p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                           ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efe87);
        uVar2 = *p_Var5;
        p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                           ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efe9c);
        if (*p_Var5 < uVar2) {
          local_1 = false;
        }
        else {
          p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                             ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efec3);
          iVar1 = *p_Var6;
          p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                             ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efed6);
          if (iVar1 < *p_Var6) {
            local_1 = true;
          }
          else {
            p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                               ((tuple<unsigned_long,_unsigned_long,_int> *)0x1efefb);
            iVar1 = *p_Var6;
            p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                               ((tuple<unsigned_long,_unsigned_long,_int> *)0x1eff0e);
            if (*p_Var6 < iVar1) {
              local_1 = false;
            }
            else {
              p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                 ((tuple<unsigned_long,_unsigned_long,_int> *)0x1eff33);
              uVar2 = *p_Var7;
              p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                 ((tuple<unsigned_long,_unsigned_long,_int> *)0x1eff48);
              if (*p_Var7 < uVar2) {
                local_1 = true;
              }
              else {
                p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                   ((tuple<unsigned_long,_unsigned_long,_int> *)0x1eff6c);
                uVar2 = *p_Var7;
                p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                   ((tuple<unsigned_long,_unsigned_long,_int> *)0x1eff81);
                if (uVar2 < *p_Var7) {
                  local_1 = false;
                }
                else {
                  iVar3 = get_index((filtration_index_t)local_c);
                  iVar4 = get_index((filtration_index_t)local_14);
                  local_1 = iVar3 < iVar4;
                }
              }
            }
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator()(Entry a, Entry b) const {
		// First order by the filtration value
		if (get_filtration(a) > get_filtration(b)) return true;
		if (get_filtration(a) < get_filtration(b)) return false;

		const auto& ta = get_coboundary_size_and_gap_and_pivot(a);
		const auto& tb = get_coboundary_size_and_gap_and_pivot(b);

		// Then the number of non-trivial coboundary entries
		if (std::get<0>(ta) < std::get<0>(tb)) return true;
		if (std::get<0>(ta) > std::get<0>(tb)) return false;

		// Then order by the better pivoting
		if (std::get<2>(ta) < std::get<2>(tb)) return true;
		if (std::get<2>(ta) > std::get<2>(tb)) return false;

		if (std::get<1>(ta) > std::get<1>(tb)) return true;
		if (std::get<1>(ta) < std::get<1>(tb)) return false;

		// Finally, order by their indices
		return get_index(a) < get_index(b);
	}